

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

void __thiscall Fl_Tree::vposition(Fl_Tree *this,int pos)

{
  double dVar1;
  Fl_Scrollbar *this_00;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if (0 < pos) {
    iVar3 = pos;
  }
  this_00 = this->_vscroll;
  dVar1 = (this_00->super_Fl_Slider).super_Fl_Valuator.max;
  iVar2 = (int)dVar1;
  if ((double)iVar3 <= dVar1) {
    iVar2 = iVar3;
  }
  if (iVar2 == (int)(this_00->super_Fl_Slider).super_Fl_Valuator.value_) {
    return;
  }
  Fl_Valuator::value((Fl_Valuator *)this_00,(double)iVar2);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Tree::vposition(int pos) {
  if (pos < 0) pos = 0;
  if (pos > _vscroll->maximum()) pos = (int)_vscroll->maximum();
  if (pos == _vscroll->value()) return;
  _vscroll->value(pos);
  redraw();
}